

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool HasValidProofOfWork(vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,
                        Params *consensusParams)

{
  CBlockHeader *pCVar1;
  bool bVar2;
  __normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
  __it;
  long lVar3;
  __normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
  _Var4;
  long lVar5;
  long in_FS_OFFSET;
  Params *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __it._M_current =
       (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pCVar1 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pCVar1 - (long)__it._M_current;
  local_40 = consensusParams;
  for (lVar3 = lVar5 / 0x50 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::$_0>
            ::operator()((_Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::__0>
                          *)&local_40,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_0036a9c1;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::$_0>
            ::operator()((_Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::__0>
                          *)&local_40,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_0036a9c1;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::$_0>
            ::operator()((_Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::__0>
                          *)&local_40,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_0036a9c1;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::$_0>
            ::operator()((_Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::__0>
                          *)&local_40,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_0036a9c1;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x140;
  }
  lVar5 = lVar5 / 0x50;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = pCVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::$_0>
                  ::operator()((_Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::__0>
                                *)&local_40,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_0036a9c1;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::$_0>
            ::operator()((_Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::__0>
                          *)&local_40,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_0036a9c1;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::$_0>
          ::operator()((_Iter_negate<HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::__0>
                        *)&local_40,__it);
  _Var4._M_current = __it._M_current;
  if (!bVar2) {
    _Var4._M_current = pCVar1;
  }
LAB_0036a9c1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return _Var4._M_current == pCVar1;
}

Assistant:

bool HasValidProofOfWork(const std::vector<CBlockHeader>& headers, const Consensus::Params& consensusParams)
{
    return std::all_of(headers.cbegin(), headers.cend(),
            [&](const auto& header) { return CheckProofOfWork(header.GetHash(), header.nBits, consensusParams);});
}